

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.h
# Opt level: O0

object_task<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>_> * __thiscall
crnlib::
crnlib_new<crnlib::object_task<crnlib::tree_clusterizer<crnlib::vec<16u,float>>>,crnlib::tree_clusterizer<crnlib::vec<16u,float>>*,void(crnlib::tree_clusterizer<crnlib::vec<16u,float>>::*)(unsigned_long_long,void*),crnlib::object_task_flags>
          (crnlib *this,tree_clusterizer<crnlib::vec<16U,_float>_> **init0,
          offset_in_tree_clusterizer<crnlib::vec<16U,_float>_>_to_subr *init1,
          object_task_flags *init2)

{
  object_task<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>_> *this_00;
  object_task<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>_> *p;
  object_task_flags *init2_local;
  offset_in_tree_clusterizer<crnlib::vec<16U,_float>_>_to_subr *init1_local;
  tree_clusterizer<crnlib::vec<16U,_float>_> **init0_local;
  
  this_00 = (object_task<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>_> *)crnlib_malloc(0x28);
  object_task<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>_>::object_task
            (this_00,*(tree_clusterizer<crnlib::vec<16U,_float>_> **)this,(object_method_ptr)*init0,
             (uint)init0[1]);
  return this_00;
}

Assistant:

inline T* crnlib_new(const A& init0, const B& init1, const C& init2)
    {
        T* p = static_cast<T*>(crnlib_malloc(sizeof(T)));
        return new (static_cast<void*>(p)) T(init0, init1, init2);
    }